

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool list_reverse(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar1;
  gravity_class_t *pgVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_fiber_t *fiber;
  undefined8 *puVar5;
  undefined8 *puVar6;
  gravity_value_t tmp;
  gravity_int_t i;
  uint32_t count;
  gravity_list_t *list;
  gravity_value_t value;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if (nargs < 2) {
    aVar1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(args->field_1).p;
    pgVar2 = (aVar1.p)->objclass;
    for (tmp.field_1.n = 0; tmp.field_1.n < (long)((ulong)pgVar2 >> 1 & 0x7fffffff);
        tmp.field_1.p = (gravity_object_t *)((long)&(tmp.field_1.p)->isa + 1)) {
      puVar5 = (undefined8 *)
               (*(long *)&(aVar1.p)->has_outer +
               ((((ulong)pgVar2 & 0xffffffff) - (long)tmp.field_1) + -1) * 0x10);
      uVar3 = *puVar5;
      uVar4 = puVar5[1];
      puVar5 = (undefined8 *)
               (*(long *)&(aVar1.p)->has_outer +
               ((((ulong)pgVar2 & 0xffffffff) - (long)tmp.field_1) + -1) * 0x10);
      puVar6 = (undefined8 *)(*(long *)&(aVar1.p)->has_outer + tmp.field_1.n * 0x10);
      *puVar5 = *puVar6;
      puVar5[1] = puVar6[1];
      puVar5 = (undefined8 *)(*(long *)&(aVar1.p)->has_outer + tmp.field_1.n * 0x10);
      *puVar5 = uVar3;
      puVar5[1] = uVar4;
    }
    value_00.field_1.p = (gravity_object_t *)aVar1.n;
    value_00.isa = (aVar1.p)->isa;
    gravity_vm_setslot(vm,value_00,rindex);
    vm_local._7_1_ = true;
  }
  else {
    snprintf(local_1028,0x1000,"Incorrect number of arguments.");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool list_reverse (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
  if (nargs > 1) RETURN_ERROR("Incorrect number of arguments.");
  gravity_value_t value = GET_VALUE(0);                            // self parameter
  gravity_list_t *list = VALUE_AS_LIST(value);
  uint32_t count = (uint32_t)marray_size(list->array);
  gravity_int_t i = 0;

  while (i < count/2) {
    gravity_value_t tmp = marray_get(list->array, count-i-1);
    marray_set(list->array, count-i-1,  marray_get(list->array, i));
    marray_set(list->array, i,  tmp);
    i++;
  }

  RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
}